

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

double __thiscall
despot::Parser::GetReward
          (Parser *this,vector<int,_std::allocator<int>_> *prev_state,
          vector<int,_std::allocator<int>_> *curr_state,ACT_TYPE action)

{
  pointer pSVar1;
  pointer piVar2;
  ulong uVar3;
  int *piVar4;
  pointer pFVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  pSVar1 = (this->prev_state_vars_).
           super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)(this->prev_state_vars_).
                super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pSVar1;
  if (lVar6 != 0) {
    lVar6 = (lVar6 >> 6) * -0x5555555555555555;
    piVar2 = (prev_state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = &(pSVar1->super_NamedVar).super_Variable.curr_value;
    lVar7 = 0;
    do {
      *piVar4 = piVar2[lVar7];
      lVar7 = lVar7 + 1;
      piVar4 = piVar4 + 0x30;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
  }
  pSVar1 = (this->curr_state_vars_).
           super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)(this->curr_state_vars_).
                super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pSVar1;
  if (lVar6 != 0) {
    lVar7 = (lVar6 >> 6) * -0x5555555555555555;
    piVar2 = (curr_state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = &(pSVar1->super_NamedVar).super_Variable.curr_value;
    lVar6 = 0;
    do {
      *piVar4 = piVar2[lVar6];
      lVar6 = lVar6 + 1;
      piVar4 = piVar4 + 0x30;
    } while (lVar7 + (ulong)(lVar7 == 0) != lVar6);
  }
  (((this->action_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
    _M_impl.super__Vector_impl_data._M_start)->super_Variable).curr_value = action;
  pFVar5 = (this->reward_funcs_).
           super__Vector_base<despot::Function,_std::allocator<despot::Function>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->reward_funcs_).super__Vector_base<despot::Function,_std::allocator<despot::Function>_>.
      _M_impl.super__Vector_impl_data._M_finish == pFVar5) {
    dVar9 = 0.0;
  }
  else {
    dVar9 = 0.0;
    lVar6 = 0;
    uVar8 = 0;
    do {
      dVar10 = (double)(**(code **)(*(long *)((long)&pFVar5->_vptr_Function + lVar6) + 0x28))
                                 ((long)&pFVar5->_vptr_Function + lVar6,0);
      dVar9 = dVar9 + dVar10;
      uVar8 = uVar8 + 1;
      pFVar5 = (this->reward_funcs_).
               super__Vector_base<despot::Function,_std::allocator<despot::Function>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->reward_funcs_).
                     super__Vector_base<despot::Function,_std::allocator<despot::Function>_>._M_impl
                     .super__Vector_impl_data._M_finish - (long)pFVar5 >> 3) * 0x2e8ba2e8ba2e8ba3;
      lVar6 = lVar6 + 0x58;
    } while (uVar8 <= uVar3 && uVar3 - uVar8 != 0);
  }
  return dVar9;
}

Assistant:

double Parser::GetReward(const vector<int>& prev_state,
	const vector<int>& curr_state, ACT_TYPE action) const {
	for (int s = 0; s < prev_state_vars_.size(); s++)
		prev_state_vars_[s].curr_value = prev_state[s];
	for (int s = 0; s < curr_state_vars_.size(); s++)
		curr_state_vars_[s].curr_value = curr_state[s];
	action_vars_[0].curr_value = action;

	double reward = 0;
	for (int r = 0; r < reward_funcs_.size(); r++)
		reward += reward_funcs_[r].GetValue();
	return reward;
}